

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_add_obj_info(p_ply ply,char *obj_info)

{
  size_t sVar1;
  char *__dest;
  long *in_RSI;
  p_ply in_RDI;
  char *new_obj_info;
  long size;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  size = 0;
  if ((in_RSI != (long *)0x0) && (sVar1 = strlen((char *)in_RSI), sVar1 < 0x400)) {
    __dest = (char *)ply_grow_array((p_ply)CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),(void **)in_RDI,
                                    in_RSI,size);
    if (__dest == (char *)0x0) {
      return 0;
    }
    strcpy(__dest,(char *)in_RSI);
    return 1;
  }
  ply_ferror(in_RDI,"Invalid arguments");
  return 0;
}

Assistant:

int ply_add_obj_info(p_ply ply, const char *obj_info) {
    char *new_obj_info = NULL;
    assert(ply && obj_info && strlen(obj_info) < LINESIZE);
    if (!obj_info || strlen(obj_info) >= LINESIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    new_obj_info = (char *)ply_grow_array(ply, (void **)&ply->obj_info,
                                          &ply->nobj_infos, LINESIZE);
    if (!new_obj_info) return 0;
    strcpy(new_obj_info, obj_info);
    return 1;
}